

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# score.c
# Opt level: O0

size_t highscore_read(high_score *scores,size_t sz)

{
  int iVar1;
  ang_file *f;
  high_score *local_438;
  size_t i;
  ang_file *scorefile;
  char fname [1024];
  size_t sz_local;
  high_score *scores_local;
  
  memset(scores,0,sz * 0x7e);
  path_build((char *)&scorefile,0x400,ANGBAND_DIR_SCORES,"scores.raw");
  safe_setuid_grab();
  f = file_open((char *)&scorefile,MODE_READ,FTYPE_TEXT);
  safe_setuid_drop();
  if (f == (ang_file *)0x0) {
    scores_local = (high_score *)0x0;
  }
  else {
    local_438 = (high_score *)0x0;
    while ((local_438 < sz && (iVar1 = file_read(f,scores[(long)local_438].what,0x7e), 0 < iVar1)))
    {
      local_438 = (high_score *)(local_438->what + 1);
    }
    file_close(f);
    scores_local = local_438;
  }
  return (size_t)scores_local;
}

Assistant:

size_t highscore_read(struct high_score scores[], size_t sz)
{
	char fname[1024];
	ang_file *scorefile;
	size_t i;

	/* Wipe current scores */
	memset(scores, 0, sz * sizeof(struct high_score));

	path_build(fname, sizeof(fname), ANGBAND_DIR_SCORES, "scores.raw");
	safe_setuid_grab();
	scorefile = file_open(fname, MODE_READ, FTYPE_TEXT);
	safe_setuid_drop();

	if (!scorefile) return 0;

	for (i = 0; i < sz; i++)
		if (file_read(scorefile, (char *)&scores[i],
					  sizeof(struct high_score)) <= 0)
			break;

	file_close(scorefile);

	return i;
}